

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O3

void __thiscall shared_ptr_count::release<Struct>(shared_ptr_count *this,Struct *p)

{
  long lVar1;
  long *plVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = this->pn;
  if (plVar2 != (long *)0x0) {
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      if (p != (Struct *)0x0) {
        Struct::_mNbInstances = Struct::_mNbInstances + -1;
      }
      operator_delete(p,4);
      operator_delete(this->pn,8);
    }
    this->pn = (long *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void release(U* p) throw() // never throws
    {
        if (NULL != pn)
        {
            --(*pn);
            if (0 == *pn)
            {
                delete p;
                delete pn;
            }
            pn = NULL;
        }
    }